

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fire_PDU.cpp
# Opt level: O3

void __thiscall KDIS::PDU::Fire_PDU::Fire_PDU(Fire_PDU *this,Header *H,KDataStream *stream)

{
  Warfare_Header::Warfare_Header(&this->super_Warfare_Header,H);
  (this->super_Warfare_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Fire_PDU_002243f0;
  DATA_TYPE::WorldCoordinates::WorldCoordinates(&this->m_Location);
  (this->m_pDescriptor)._vptr_KRef_Ptr = (_func_int **)&PTR__KRef_Ptr_002243c0;
  (this->m_pDescriptor).m_pRef = (Descriptor *)0x0;
  (this->m_pDescriptor).m_piCount = (RefCounter *)0x0;
  DATA_TYPE::Vector::Vector(&this->m_Velocity);
  (*(this->super_Warfare_Header).super_Header.super_Header6._vptr_Header6[3])(this,stream,1);
  return;
}

Assistant:

Fire_PDU::Fire_PDU(const Header &H, KDataStream &stream) noexcept(false) :
    Warfare_Header( H )
{
    Decode( stream, true );
}